

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int relocatePage(BtShared *pBt,MemPage *pDbPage,u8 eType,Pgno iPtrPage,Pgno iFreePage,int isCommit)

{
  uint iFrom;
  Pgno newPgno;
  Pager *pPager;
  PgHdr *pPg;
  bool bVar1;
  MemPage *pPage;
  int iVar2;
  int iVar3;
  DbPage *p;
  Pgno i;
  uint uVar4;
  long in_FS_OFFSET;
  int rc;
  MemPage *pPtrPage;
  int local_4c;
  MemPage *local_48;
  PgHdr *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = (MemPage *)&DAT_aaaaaaaaaaaaaaaa;
  iFrom = pDbPage->pgno;
  pPager = pBt->pPager;
  local_4c = -0x55555556;
  if (iFrom < 3) {
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x123c8,
                "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
    iVar2 = 0xb;
    goto LAB_001419f0;
  }
  pPg = pDbPage->pDbPage;
  if (((pPager->tempFile == '\0') || (iVar2 = sqlite3PagerWrite(pPg), iVar2 == 0)) &&
     (((pPg->flags & 2) == 0 || (iVar2 = subjournalPageIfRequired(pPg), iVar2 == 0)))) {
    i = 0;
    if ((isCommit == 0) && (i = 0, (pPg->flags & 8) != 0)) {
      i = pPg->pgno;
    }
    pPg->flags = pPg->flags & 0xfff7;
    p = sqlite3PagerLookup(pPager,iFreePage);
    if (p != (DbPage *)0x0) {
      if (1 < p->nRef) {
        sqlite3PagerUnrefNotNull(p);
        iVar2 = 0xb;
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xfc16,
                    "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
        goto LAB_001418b0;
      }
      pPg->flags = pPg->flags | p->flags & 8;
      if (pPager->tempFile == '\0') {
        sqlite3PcacheDrop(p);
      }
      else {
        sqlite3PcacheMove(p,pPager->dbSize + 1);
      }
    }
    newPgno = pPg->pgno;
    sqlite3PcacheMove(pPg,iFreePage);
    sqlite3PcacheMakeDirty(pPg);
    if ((p != (DbPage *)0x0) && (pPager->tempFile != '\0')) {
      sqlite3PcacheMove(p,newPgno);
      sqlite3PagerUnrefNotNull(p);
    }
    if (i != 0) {
      local_40 = (PgHdr *)&DAT_aaaaaaaaaaaaaaaa;
      iVar2 = (*pPager->xGet)(pPager,i,&local_40,0);
      if (iVar2 == 0) {
        local_40->flags = local_40->flags | 8;
        sqlite3PcacheMakeDirty(local_40);
        sqlite3PagerUnrefNotNull(local_40);
      }
      else if (i <= pPager->dbOrigSize) {
        sqlite3BitvecClear(pPager->pInJournal,i,pPager->pTmpSpace);
      }
      if (iVar2 != 0) goto LAB_001418b0;
    }
    iVar2 = 0;
  }
LAB_001418b0:
  local_4c = iVar2;
  if (iVar2 == 0) {
    pDbPage->pgno = iFreePage;
    if ((eType & 0xfb) == 1) {
      iVar2 = setChildPtrmaps(pDbPage);
      local_4c = iVar2;
      if (iVar2 != 0) goto LAB_001419f0;
    }
    else {
      uVar4 = *(uint *)pDbPage->aData;
      uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
      if ((uVar4 == 0) || (ptrmapPut(pBt,uVar4,'\x04',iFreePage,&local_4c), local_4c == 0)) {
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
      iVar2 = local_4c;
      if (!bVar1) goto LAB_001419f0;
    }
    iVar2 = local_4c;
    if ((eType != '\x01') &&
       (iVar2 = btreeGetPage(pBt,iPtrPage,&local_48,0), pPage = local_48, local_4c = iVar2,
       iVar2 == 0)) {
      iVar2 = sqlite3PagerWrite(local_48->pDbPage);
      local_4c = iVar2;
      if (iVar2 == 0) {
        iVar3 = modifyPagePointer(pPage,iFrom,iFreePage,eType);
        local_4c = iVar3;
        if (pPage != (MemPage *)0x0) {
          sqlite3PagerUnrefNotNull(pPage->pDbPage);
        }
        iVar2 = local_4c;
        if (iVar3 == 0) {
          ptrmapPut(pBt,iFreePage,eType,iPtrPage,&local_4c);
          iVar2 = local_4c;
        }
      }
      else if (pPage != (MemPage *)0x0) {
        sqlite3PagerUnrefNotNull(pPage->pDbPage);
      }
    }
  }
LAB_001419f0:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

static int relocatePage(
  BtShared *pBt,           /* Btree */
  MemPage *pDbPage,        /* Open page to move */
  u8 eType,                /* Pointer map 'type' entry for pDbPage */
  Pgno iPtrPage,           /* Pointer map 'page-no' entry for pDbPage */
  Pgno iFreePage,          /* The location to move pDbPage to */
  int isCommit             /* isCommit flag passed to sqlite3PagerMovepage */
){
  MemPage *pPtrPage;   /* The page that contains a pointer to pDbPage */
  Pgno iDbPage = pDbPage->pgno;
  Pager *pPager = pBt->pPager;
  int rc;

  assert( eType==PTRMAP_OVERFLOW2 || eType==PTRMAP_OVERFLOW1 ||
      eType==PTRMAP_BTREE || eType==PTRMAP_ROOTPAGE );
  assert( sqlite3_mutex_held(pBt->mutex) );
  assert( pDbPage->pBt==pBt );
  if( iDbPage<3 ) return SQLITE_CORRUPT_BKPT;

  /* Move page iDbPage from its current location to page number iFreePage */
  TRACE(("AUTOVACUUM: Moving %u to free page %u (ptr page %u type %u)\n",
      iDbPage, iFreePage, iPtrPage, eType));
  rc = sqlite3PagerMovepage(pPager, pDbPage->pDbPage, iFreePage, isCommit);
  if( rc!=SQLITE_OK ){
    return rc;
  }
  pDbPage->pgno = iFreePage;

  /* If pDbPage was a btree-page, then it may have child pages and/or cells
  ** that point to overflow pages. The pointer map entries for all these
  ** pages need to be changed.
  **
  ** If pDbPage is an overflow page, then the first 4 bytes may store a
  ** pointer to a subsequent overflow page. If this is the case, then
  ** the pointer map needs to be updated for the subsequent overflow page.
  */
  if( eType==PTRMAP_BTREE || eType==PTRMAP_ROOTPAGE ){
    rc = setChildPtrmaps(pDbPage);
    if( rc!=SQLITE_OK ){
      return rc;
    }
  }else{
    Pgno nextOvfl = get4byte(pDbPage->aData);
    if( nextOvfl!=0 ){
      ptrmapPut(pBt, nextOvfl, PTRMAP_OVERFLOW2, iFreePage, &rc);
      if( rc!=SQLITE_OK ){
        return rc;
      }
    }
  }

  /* Fix the database pointer on page iPtrPage that pointed at iDbPage so
  ** that it points at iFreePage. Also fix the pointer map entry for
  ** iPtrPage.
  */
  if( eType!=PTRMAP_ROOTPAGE ){
    rc = btreeGetPage(pBt, iPtrPage, &pPtrPage, 0);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    rc = sqlite3PagerWrite(pPtrPage->pDbPage);
    if( rc!=SQLITE_OK ){
      releasePage(pPtrPage);
      return rc;
    }
    rc = modifyPagePointer(pPtrPage, iDbPage, iFreePage, eType);
    releasePage(pPtrPage);
    if( rc==SQLITE_OK ){
      ptrmapPut(pBt, iFreePage, eType, iPtrPage, &rc);
    }
  }
  return rc;
}